

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qedidparser.cpp
# Opt level: O2

QString * __thiscall
QEdidParser::parseEdidString(QString *__return_storage_ptr__,QEdidParser *this,quint8 *data)

{
  char *pcVar1;
  int i;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_38,(char *)data,0xd);
  puVar2 = (undefined1 *)0x0;
  do {
    if ((ulong)local_38.size <= puVar2) {
LAB_005c24b5:
      QString::fromLatin1<void>(__return_storage_ptr__,(QByteArray *)&local_38);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    pcVar1 = QByteArray::data((QByteArray *)&local_38);
    if (pcVar1[(long)puVar2] == '\n') {
      QByteArray::truncate((longlong)&local_38);
      goto LAB_005c24b5;
    }
    pcVar1 = QByteArray::data((QByteArray *)&local_38);
    if (pcVar1[(long)puVar2] < ' ') {
LAB_005c2498:
      pcVar1 = QByteArray::data((QByteArray *)&local_38);
      pcVar1[(long)puVar2] = '-';
    }
    else {
      pcVar1 = QByteArray::data((QByteArray *)&local_38);
      if (pcVar1[(long)puVar2] == '\x7f') goto LAB_005c2498;
    }
    puVar2 = puVar2 + 1;
  } while( true );
}

Assistant:

QString QEdidParser::parseEdidString(const quint8 *data)
{
    QByteArray buffer(reinterpret_cast<const char *>(data), 13);

    for (int i = 0; i < buffer.size(); ++i) {
        // If there are less than 13 characters in the string, the string
        // is terminated with the ASCII code ‘0Ah’ (line feed) and padded
        // with ASCII code ‘20h’ (space). See EDID 1.4, sections 3.10.3.1,
        // 3.10.3.2, and 3.10.3.4.
        if (buffer[i] == '\n') {
            buffer.truncate(i);
            break;
        }

        // Replace non-printable characters with dash
        if (buffer[i] < '\040' || buffer[i] > '\176')
            buffer[i] = '-';
    }

    return QString::fromLatin1(buffer);
}